

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O1

int __thiscall FShaderManager::Find(FShaderManager *this,char *shn)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = FName::NameManager::FindName(&FName::NameData,shn,false);
  uVar1 = (this->mTextureEffects).Count;
  if (uVar1 != 0) {
    lVar3 = 0;
    do {
      if (((this->mTextureEffects).Array[lVar3]->mName).Index == iVar2) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
    } while (uVar1 != (uint)lVar3);
  }
  return -1;
}

Assistant:

int FShaderManager::Find(const char * shn)
{
	FName sfn = shn;

	for(unsigned int i=0;i<mTextureEffects.Size();i++)
	{
		if (mTextureEffects[i]->mName == sfn)
		{
			return i;
		}
	}
	return -1;
}